

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

Vec_Ptr_t * Gia_ManCollapse(Gia_Man_t *p,DdManager *dd,int nBddLimit,int fVerbose)

{
  uint nCap;
  void **__s;
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  DdNode *pDVar3;
  Gia_Obj_t *pGVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  Gia_ManCreateRefs(p);
  nCap = p->nObjs;
  p_00 = Vec_PtrAlloc(nCap);
  p_00->nSize = nCap;
  __s = p_00->pArray;
  iVar9 = 0;
  memset(__s,0,(long)(int)nCap << 3);
  if (0 < *p->pRefs) {
    pDVar3 = Cudd_ReadLogicZero(dd);
    Vec_PtrWriteEntry(p_00,0,pDVar3);
    pDVar3 = Cudd_ReadLogicZero(dd);
    Cudd_Ref(pDVar3);
  }
  for (; iVar9 < p->vCis->nSize; iVar9 = iVar9 + 1) {
    iVar1 = Vec_IntEntry(p->vCis,iVar9);
    pGVar4 = Gia_ManObj(p,iVar1);
    iVar1 = Gia_ObjId(p,pGVar4);
    if (iVar1 == 0) break;
    if (0 < p->pRefs[iVar1]) {
      pDVar3 = Cudd_bddIthVar(dd,iVar9);
      Vec_PtrWriteEntry(p_00,iVar1,pDVar3);
      pDVar3 = Cudd_bddIthVar(dd,iVar9);
      Cudd_Ref(pDVar3);
    }
  }
  iVar9 = 0;
  while ((iVar9 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar9), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar2 = (uint)*(undefined8 *)pGVar4;
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      pvVar5 = Vec_PtrEntry(p_00,iVar9 - (uVar2 & 0x1fffffff));
      uVar7 = *(ulong *)pGVar4;
      pvVar6 = Vec_PtrEntry(p_00,iVar9 - ((uint)(uVar7 >> 0x20) & 0x1fffffff));
      pDVar3 = Cudd_bddAndLimit(dd,(DdNode *)((ulong)((uint)(uVar7 >> 0x1d) & 1) ^ (ulong)pvVar5),
                                (DdNode *)
                                ((ulong)((uint)((ulong)*(undefined8 *)pGVar4 >> 0x3d) & 1) ^
                                (ulong)pvVar6),nBddLimit);
      if (pDVar3 == (DdNode *)0x0) {
        Gia_ManCollapseDeref(dd,p_00);
        return (Vec_Ptr_t *)0x0;
      }
      Cudd_Ref(pDVar3);
      Vec_PtrWriteEntry(p_00,iVar9,pDVar3);
      Gia_ObjCollapseDeref(p,dd,p_00,iVar9 - (*(uint *)pGVar4 & 0x1fffffff));
      Gia_ObjCollapseDeref(p,dd,p_00,iVar9 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
    }
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCo(p,iVar9);
    iVar1 = Gia_ObjId(p,pGVar4);
    if (iVar1 == 0) break;
    pGVar4 = Gia_ManCo(p,iVar9);
    pvVar5 = Vec_PtrEntry(p_00,iVar1 - (*(uint *)pGVar4 & 0x1fffffff));
    pDVar3 = (DdNode *)((ulong)(*(uint *)pGVar4 >> 0x1d & 1) ^ (ulong)pvVar5);
    Vec_PtrWriteEntry(p_00,iVar1,pDVar3);
    Cudd_Ref(pDVar3);
    Gia_ObjCollapseDeref(p,dd,p_00,iVar1 - (*(uint *)pGVar4 & 0x1fffffff));
  }
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)nCap) {
    uVar8 = (ulong)nCap;
  }
  iVar9 = 0;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    iVar9 = iVar9 + (uint)(__s[uVar7] == (void *)0x0);
  }
  iVar1 = p->vCos->nSize;
  if (nCap != iVar9 + iVar1) {
    __assert_fail("Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaClp.c"
                  ,0x14c,"Vec_Ptr_t *Gia_ManCollapse(Gia_Man_t *, DdManager *, int, int)");
  }
  iVar9 = 0;
  do {
    if (iVar1 <= iVar9) {
LAB_005b68c4:
      if (iVar1 <= (int)nCap) {
        p_00->nSize = iVar1;
        return p_00;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    pGVar4 = Gia_ManCo(p,iVar9);
    iVar1 = Gia_ObjId(p,pGVar4);
    if (iVar1 == 0) {
      iVar1 = p->vCos->nSize;
      goto LAB_005b68c4;
    }
    pvVar5 = Vec_PtrEntry(p_00,iVar1);
    Vec_PtrWriteEntry(p_00,iVar9,pvVar5);
    iVar9 = iVar9 + 1;
    iVar1 = p->vCos->nSize;
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_ManCollapse( Gia_Man_t * p, DdManager * dd, int nBddLimit, int fVerbose )
{
    Vec_Ptr_t * vFuncs;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Gia_Obj_t * pObj;
    int i, Id;
    Gia_ManCreateRefs( p );
    // assign constant node
    vFuncs = Vec_PtrStart( Gia_ManObjNum(p) );
    if ( Gia_ObjRefNumId(p, 0) > 0 )
        Vec_PtrWriteEntry( vFuncs, 0, Cudd_ReadLogicZero(dd) ), Cudd_Ref(Cudd_ReadLogicZero(dd));
    // assign elementary variables
    Gia_ManForEachCiId( p, Id, i )
        if ( Gia_ObjRefNumId(p, Id) > 0 )
            Vec_PtrWriteEntry( vFuncs, Id, Cudd_bddIthVar(dd,i) ), Cudd_Ref(Cudd_bddIthVar(dd,i));
    // create BDD for AND nodes
    Gia_ManForEachAnd( p, pObj, i )
    {
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, i)), Gia_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId1(pObj, i)), Gia_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddLimit );  
        if ( bFunc == NULL )
        {
            Gia_ManCollapseDeref( dd, vFuncs );
            return NULL;
        }        
        Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vFuncs, i, bFunc );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, i) );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId1(pObj, i) );
    }
    // create BDD for outputs
    Gia_ManForEachCoId( p, Id, i )
    {
        pObj = Gia_ManCo( p, i );
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
        Vec_PtrWriteEntry( vFuncs, Id, bFunc0 ); Cudd_Ref( bFunc0 );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, Id) );
    }
    assert( Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p) );
    // compact
    Gia_ManForEachCoId( p, Id, i )
        Vec_PtrWriteEntry( vFuncs, i, Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrShrink( vFuncs, Gia_ManCoNum(p) );
    return vFuncs;
}